

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

OnCallSpec<__locale_struct_*(int,_const_char_*,___locale_struct_*)> * __thiscall
testing::internal::FunctionMockerBase<__locale_struct_*(int,_const_char_*,___locale_struct_*)>::
FindOnCallSpec(FunctionMockerBase<__locale_struct_*(int,_const_char_*,___locale_struct_*)> *this,
              ArgumentTuple *args)

{
  OnCallSpec<__locale_struct_*(int,_const_char_*,___locale_struct_*)> *this_00;
  bool bVar1;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar2;
  
  ppvVar2 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppvVar2 ==
        (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      return (OnCallSpec<__locale_struct_*(int,_const_char_*,___locale_struct_*)> *)0x0;
    }
    this_00 = (OnCallSpec<__locale_struct_*(int,_const_char_*,___locale_struct_*)> *)ppvVar2[-1];
    ppvVar2 = ppvVar2 + -1;
    bVar1 = OnCallSpec<__locale_struct_*(int,_const_char_*,___locale_struct_*)>::Matches
                      (this_00,args);
  } while (!bVar1);
  return this_00;
}

Assistant:

const OnCallSpec<F>* FindOnCallSpec(
      const ArgumentTuple& args) const {
    for (UntypedOnCallSpecs::const_reverse_iterator it
             = untyped_on_call_specs_.rbegin();
         it != untyped_on_call_specs_.rend(); ++it) {
      const OnCallSpec<F>* spec = static_cast<const OnCallSpec<F>*>(*it);
      if (spec->Matches(args))
        return spec;
    }

    return NULL;
  }